

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O0

laszip_I32 laszip_create(laszip_POINTER *pointer)

{
  laszip_dll *this;
  laszip_dll_struct *laszip_dll;
  laszip_POINTER *pointer_local;
  
  if (pointer == (laszip_POINTER *)0x0) {
    pointer_local._4_4_ = 1;
  }
  else {
    this = (laszip_dll *)operator_new(0xac8);
    ::laszip_dll::laszip_dll(this);
    if (this == (laszip_dll *)0x0) {
      pointer_local._4_4_ = 1;
    }
    else {
      ::laszip_dll::zero(this);
      laszip_clean(this);
      *pointer = this;
      pointer_local._4_4_ = 0;
    }
  }
  return pointer_local._4_4_;
}

Assistant:

LASZIP_API laszip_I32
laszip_create(
    laszip_POINTER*                    pointer
)
{
  if (pointer == 0) return 1;

  try
  {
    laszip_dll_struct* laszip_dll = new laszip_dll_struct;
    if (laszip_dll == 0)
    {
      return 1;
    }

    // zero every field of the laszip_dll struct

    laszip_dll->zero();

    // create the default

    laszip_clean(laszip_dll);

    *pointer = laszip_dll;
  }
  catch (...)
  {
    return 1;
  }

  return 0;
}